

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void wal_delete_compact_upto_test(void)

{
  fdb_seqnum_t seqnum;
  fdb_status fVar1;
  int iVar2;
  size_t sVar3;
  size_t sVar4;
  fdb_kvs_handle *pfVar5;
  long extraout_RDX;
  char *pcVar6;
  fdb_kvs_handle *pfVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  fdb_kvs_handle **ptr_handle;
  fdb_file_handle *pfVar11;
  fdb_iterator *pfVar12;
  fdb_kvs_handle *pfVar13;
  long lVar14;
  fdb_kvs_handle *unaff_R13;
  ulong uVar15;
  char *pcVar16;
  fdb_doc **doc;
  char *pcVar17;
  fdb_kvs_info *info;
  fdb_kvs_handle *doc_00;
  undefined4 uVar18;
  undefined4 uVar19;
  fdb_kvs_handle *db;
  fdb_file_handle *dbfile;
  fdb_snapshot_info_t *markers;
  uint64_t num_markers;
  size_t valuelen;
  void *value;
  timeval __test_begin;
  fdb_kvs_config kvs_config;
  fdb_kvs_info kvs_info;
  char keybuf [256];
  fdb_config fconfig;
  fdb_file_handle *pfStackY_1280;
  timeval tStackY_1278;
  fdb_config fStackY_1268;
  code *pcStackY_1170;
  fdb_snapshot_info_t *pfStackY_1168;
  ulong uStackY_1160;
  fdb_kvs_handle *pfStackY_1158;
  fdb_kvs_handle *pfStackY_1150;
  fdb_kvs_config fStackY_1148;
  timeval tStackY_1130;
  char *pcStackY_1120;
  char *pcStackY_1118;
  fdb_kvs_handle *pfStackY_1110;
  char *pcStackY_1108;
  char *pcStackY_1100;
  code *pcStackY_10f8;
  fdb_file_handle *pfStackY_10e8;
  int iStackY_10dc;
  fdb_kvs_handle *pfStackY_10d8;
  fdb_kvs_handle *pfStackY_10d0;
  fdb_kvs_handle *pfStackY_10c8;
  fdb_kvs_handle *pfStackY_10c0;
  fdb_kvs_handle *pfStackY_10b8;
  undefined8 uStackY_10b0;
  undefined8 uStackY_10a8;
  undefined8 uStackY_10a0;
  timeval tStackY_1090;
  fdb_kvs_config fStackY_1080;
  fdb_config fStackY_1068;
  char acStackY_f70 [256];
  char acStackY_e70 [272];
  char *pcStackY_d60;
  fdb_kvs_handle *pfStackY_d58;
  char *pcStackY_d48;
  code *pcStackY_d40;
  fdb_snapshot_info_t *pfStackY_d30;
  fdb_kvs_handle *pfStackY_d28;
  uint64_t uStackY_d20;
  timeval tStackY_d18;
  size_t sStackY_d08;
  fdb_kvs_handle **ppfStackY_d00;
  code *pcStackY_cf8;
  fdb_kvs_handle *pfStackY_cf0;
  fdb_kvs_handle *pfStackY_ce8;
  fdb_kvs_handle *pfStackY_ce0;
  fdb_kvs_handle *pfStackY_cd8;
  undefined8 uStackY_cd0;
  undefined8 uStackY_cc8;
  fdb_kvs_handle *pfStackY_cc0;
  timeval tStackY_cb0;
  fdb_kvs_config fStackY_ca0;
  fdb_config fStackY_c88;
  char acStackY_b90 [256];
  fdb_kvs_handle *apfStackY_a90 [33];
  fdb_kvs_handle *pfStackY_988;
  fdb_kvs_handle *pfStackY_980;
  fdb_kvs_handle *pfStackY_978;
  char *pcStackY_970;
  fdb_kvs_handle *pfStackY_968;
  fdb_kvs_handle *pfStackY_960;
  fdb_iterator *pfStack_948;
  uint uStack_93c;
  fdb_kvs_handle *pfStack_938;
  fdb_file_handle *pfStack_930;
  fdb_kvs_handle *pfStack_928;
  char *pcStack_920;
  int iStack_918;
  undefined4 uStack_914;
  fdb_snapshot_info_t *pfStack_910;
  fdb_kvs_handle *pfStack_908;
  fdb_kvs_handle *pfStack_900;
  long lStack_8f8;
  fdb_kvs_config fStack_8f0;
  char acStack_8d8 [256];
  timeval tStack_7d8;
  undefined1 auStack_7c8 [312];
  size_t sStack_690;
  undefined1 uStack_680;
  undefined2 uStack_678;
  undefined1 uStack_658;
  list *plStack_5e0;
  fdb_seqnum_t *pfStack_5a0;
  fdb_kvs_handle *pfStack_598;
  fdb_kvs_handle *pfStack_590;
  fdb_doc **ppfStack_588;
  fdb_kvs_info *pfStack_580;
  fdb_kvs_handle *pfStack_578;
  fdb_kvs_handle *pfStack_568;
  fdb_kvs_handle *pfStack_560;
  fdb_file_handle *pfStack_558;
  fdb_doc *pfStack_550;
  fdb_iterator *pfStack_548;
  fdb_snapshot_info_t *pfStack_540;
  uint64_t uStack_538;
  fdb_kvs_info fStack_530;
  timeval tStack_500;
  fdb_kvs_config fStack_4f0;
  fdb_config fStack_4d8;
  fdb_doc *apfStack_3e0 [32];
  char *pcStack_2e0;
  fdb_kvs_handle *pfStack_2d8;
  fdb_kvs_handle *pfStack_2d0;
  char *pcStack_2c8;
  fdb_kvs_handle *pfStack_2c0;
  fdb_kvs_handle *local_2b0;
  fdb_file_handle *local_2a8;
  fdb_snapshot_info_t *local_2a0;
  uint64_t local_298;
  undefined1 local_290 [16];
  timeval local_280;
  fdb_kvs_config local_270;
  fdb_kvs_info local_258;
  char local_228 [256];
  fdb_config local_128;
  
  pfStack_2c0 = (fdb_kvs_handle *)0x11231a;
  gettimeofday(&local_280,(__timezone_ptr_t)0x0);
  pfStack_2c0 = (fdb_kvs_handle *)0x11231f;
  memleak_start();
  pfStack_2c0 = (fdb_kvs_handle *)0x11232b;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_2c0 = (fdb_kvs_handle *)0x11233b;
  fdb_get_default_config();
  pfStack_2c0 = (fdb_kvs_handle *)0x112348;
  fdb_get_default_kvs_config();
  local_128.wal_threshold = 0x13;
  local_128.flags = 1;
  pfStack_2c0 = (fdb_kvs_handle *)0x11236e;
  fdb_open(&local_2a8,"./compact_test5",&local_128);
  pfStack_2c0 = (fdb_kvs_handle *)0x11237e;
  fdb_kvs_open_default(local_2a8,&local_2b0,&local_270);
  pcVar6 = "key%d";
  pcVar16 = local_228;
  pcVar17 = "value";
  pfVar5 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x1123a5;
    sprintf(pcVar16,"key%d",pfVar5);
    pfVar13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x1123b2;
    sVar3 = strlen(pcVar16);
    pfStack_2c0 = (fdb_kvs_handle *)0x1123c9;
    fVar1 = fdb_set_kv(pfVar13,pcVar16,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_2c0 = (fdb_kvs_handle *)0x112636;
      wal_delete_compact_upto_test();
      goto LAB_00112636;
    }
    uVar8 = (int)pfVar5 + 1;
    pfVar5 = (fdb_kvs_handle *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_2c0 = (fdb_kvs_handle *)0x1123e7;
  fVar1 = fdb_commit(local_2a8,'\x01');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112645;
  pcVar6 = (char *)0xa;
  pcVar16 = "key%d";
  pcVar17 = local_228;
  pfVar13 = (fdb_kvs_handle *)0x14df20;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x112419;
    sprintf(pcVar17,"key%d",pcVar6);
    unaff_R13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x112426;
    sVar3 = strlen(pcVar17);
    pfStack_2c0 = (fdb_kvs_handle *)0x11243d;
    fVar1 = fdb_set_kv(unaff_R13,pcVar17,sVar3,"value",5);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112636;
    uVar8 = (int)pcVar6 + 1;
    pcVar6 = (char *)(ulong)uVar8;
  } while (uVar8 != 0x14);
  pcVar6 = (char *)0xf;
  pcVar16 = "key%d";
  pcVar17 = local_228;
  do {
    pfStack_2c0 = (fdb_kvs_handle *)0x11246f;
    sprintf(pcVar17,"key%d",pcVar6);
    pfVar13 = local_2b0;
    pfStack_2c0 = (fdb_kvs_handle *)0x11247c;
    sVar3 = strlen(pcVar17);
    pfStack_2c0 = (fdb_kvs_handle *)0x11248a;
    fVar1 = fdb_del_kv(pfVar13,pcVar17,sVar3);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011263b;
    uVar8 = (int)pcVar6 + 1;
    pcVar6 = (char *)(ulong)uVar8;
  } while (uVar8 != 0x14);
  pfStack_2c0 = (fdb_kvs_handle *)0x1124a5;
  fVar1 = fdb_commit(local_2a8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264a;
  pcVar6 = local_228;
  pfStack_2c0 = (fdb_kvs_handle *)0x1124cb;
  sprintf(pcVar6,"key%d",0x14);
  pcVar16 = (char *)local_2b0;
  pfStack_2c0 = (fdb_kvs_handle *)0x1124d8;
  sVar3 = strlen(pcVar6);
  pfStack_2c0 = (fdb_kvs_handle *)0x1124f3;
  fVar1 = fdb_set_kv((fdb_kvs_handle *)pcVar16,pcVar6,sVar3,"value",5);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011264f;
  pfStack_2c0 = (fdb_kvs_handle *)0x112507;
  fVar1 = fdb_commit(local_2a8,'\0');
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112654;
  pfStack_2c0 = (fdb_kvs_handle *)0x112523;
  fVar1 = fdb_get_all_snap_markers(local_2a8,&local_2a0,&local_298);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112659;
  pfStack_2c0 = (fdb_kvs_handle *)0x112540;
  fVar1 = fdb_compact_upto(local_2a8,(char *)0x0,local_2a0[1].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011265e;
  pfStack_2c0 = (fdb_kvs_handle *)0x112557;
  fVar1 = fdb_free_snap_markers(local_2a0,local_298);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00112663;
  pfStack_2c0 = (fdb_kvs_handle *)0x11256e;
  fVar1 = fdb_get_kvs_info(local_2b0,&local_258);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar6 = (char *)0xf;
    pcVar16 = "key%d";
    pcVar17 = local_228;
    pfVar13 = (fdb_kvs_handle *)(local_290 + 8);
    unaff_R13 = (fdb_kvs_handle *)local_290;
    while( true ) {
      pfStack_2c0 = (fdb_kvs_handle *)0x1125a3;
      sprintf(pcVar17,"key%d",pcVar6);
      pfVar5 = local_2b0;
      pfStack_2c0 = (fdb_kvs_handle *)0x1125b0;
      sVar3 = strlen(pcVar17);
      pfStack_2c0 = (fdb_kvs_handle *)0x1125c4;
      fVar1 = fdb_get_kv(pfVar5,pcVar17,sVar3,(void **)pfVar13,(size_t *)unaff_R13);
      if (fVar1 != FDB_RESULT_KEY_NOT_FOUND) break;
      uVar8 = (int)pcVar6 + 1;
      pcVar6 = (char *)(ulong)uVar8;
      if (uVar8 == 0x14) {
        pfStack_2c0 = (fdb_kvs_handle *)0x1125da;
        fdb_kvs_close(local_2b0);
        pfStack_2c0 = (fdb_kvs_handle *)0x1125e4;
        fdb_close(local_2a8);
        pfStack_2c0 = (fdb_kvs_handle *)0x1125e9;
        fdb_shutdown();
        pfStack_2c0 = (fdb_kvs_handle *)0x1125ee;
        memleak_end();
        pcVar16 = "%s PASSED\n";
        if (wal_delete_compact_upto_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        pfStack_2c0 = (fdb_kvs_handle *)0x11261f;
        fprintf(_stderr,pcVar16,"compact upto with wal deletes test");
        return;
      }
    }
    goto LAB_00112640;
  }
  goto LAB_00112668;
LAB_001129a8:
  pfStack_578 = (fdb_kvs_handle *)0x1129ad;
  compact_upto_post_snapshot_test();
LAB_001129ad:
  pfStack_578 = (fdb_kvs_handle *)0x1129b2;
  compact_upto_post_snapshot_test();
LAB_001129b2:
  pfStack_578 = (fdb_kvs_handle *)0x1129b7;
  compact_upto_post_snapshot_test();
  goto LAB_001129b7;
LAB_0011305f:
  pfStackY_960 = (fdb_kvs_handle *)0x113064;
  compact_upto_overwrite_test();
LAB_00113064:
  pfStackY_960 = (fdb_kvs_handle *)0x113069;
  compact_upto_overwrite_test();
LAB_00113069:
  pfVar5 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  pfStackY_960 = (fdb_kvs_handle *)0x11306e;
  compact_upto_overwrite_test();
LAB_0011306e:
  pfStackY_960 = (fdb_kvs_handle *)0x11307e;
  compact_upto_overwrite_test();
LAB_0011307e:
  pfStackY_960 = (fdb_kvs_handle *)0x113089;
  compact_upto_overwrite_test();
LAB_00113089:
  pfStackY_960 = (fdb_kvs_handle *)0x11308e;
  compact_upto_overwrite_test();
LAB_0011308e:
  pfStackY_960 = (fdb_kvs_handle *)0x113093;
  compact_upto_overwrite_test();
LAB_00113093:
  pfStackY_960 = (fdb_kvs_handle *)0x113098;
  compact_upto_overwrite_test();
LAB_00113098:
  pfStackY_960 = (fdb_kvs_handle *)0x11309d;
  compact_upto_overwrite_test();
LAB_0011309d:
  pfStackY_960 = (fdb_kvs_handle *)0x1130a2;
  compact_upto_overwrite_test();
LAB_001130a2:
  pfStackY_960 = (fdb_kvs_handle *)0x1130a7;
  compact_upto_overwrite_test();
  goto LAB_001130a7;
LAB_00112636:
  pfStack_2c0 = (fdb_kvs_handle *)0x11263b;
  wal_delete_compact_upto_test();
LAB_0011263b:
  pfStack_2c0 = (fdb_kvs_handle *)0x112640;
  wal_delete_compact_upto_test();
LAB_00112640:
  pfStack_2c0 = (fdb_kvs_handle *)0x112645;
  wal_delete_compact_upto_test();
LAB_00112645:
  pfStack_2c0 = (fdb_kvs_handle *)0x11264a;
  wal_delete_compact_upto_test();
LAB_0011264a:
  pfStack_2c0 = (fdb_kvs_handle *)0x11264f;
  wal_delete_compact_upto_test();
LAB_0011264f:
  pfStack_2c0 = (fdb_kvs_handle *)0x112654;
  wal_delete_compact_upto_test();
LAB_00112654:
  pfStack_2c0 = (fdb_kvs_handle *)0x112659;
  wal_delete_compact_upto_test();
LAB_00112659:
  pfStack_2c0 = (fdb_kvs_handle *)0x11265e;
  wal_delete_compact_upto_test();
LAB_0011265e:
  pfStack_2c0 = (fdb_kvs_handle *)0x112663;
  wal_delete_compact_upto_test();
LAB_00112663:
  pfStack_2c0 = (fdb_kvs_handle *)0x112668;
  wal_delete_compact_upto_test();
LAB_00112668:
  pfStack_2c0 = (fdb_kvs_handle *)compact_upto_post_snapshot_test;
  wal_delete_compact_upto_test();
  pfStack_578 = (fdb_kvs_handle *)0x11268b;
  pcStack_2e0 = pcVar6;
  pfStack_2d8 = pfVar13;
  pfStack_2d0 = (fdb_kvs_handle *)pcVar16;
  pcStack_2c8 = pcVar17;
  pfStack_2c0 = pfVar5;
  gettimeofday(&tStack_500,(__timezone_ptr_t)0x0);
  pfStack_578 = (fdb_kvs_handle *)0x112690;
  memleak_start();
  pfStack_550 = (fdb_doc *)0x0;
  pfStack_578 = (fdb_kvs_handle *)0x1126a1;
  system("rm -rf  compact_test* > errorlog.txt");
  pfStack_578 = (fdb_kvs_handle *)0x1126b1;
  fdb_get_default_config();
  pfStack_578 = (fdb_kvs_handle *)0x1126c1;
  fdb_get_default_kvs_config();
  fStack_4d8.wal_threshold = 0x400;
  fStack_4d8.flags = 1;
  fStack_4d8.block_reusing_threshold = 0;
  pfStack_578 = (fdb_kvs_handle *)0x1126ee;
  fdb_open(&pfStack_558,"./compact_test1",&fStack_4d8);
  pfStack_578 = (fdb_kvs_handle *)0x1126fe;
  fdb_kvs_open_default(pfStack_558,&pfStack_560,&fStack_4f0);
  pcVar16 = "key%d";
  doc = apfStack_3e0;
  info = (fdb_kvs_info *)0x14df20;
  pcVar6 = (char *)0x0;
  do {
    pfStack_578 = (fdb_kvs_handle *)0x112725;
    sprintf((char *)doc,"key%d",pcVar6);
    pfVar5 = pfStack_560;
    pfStack_578 = (fdb_kvs_handle *)0x112732;
    sVar3 = strlen((char *)doc);
    pfStack_578 = (fdb_kvs_handle *)0x112749;
    pfVar13 = pfVar5;
    fVar1 = fdb_set_kv(pfVar5,doc,sVar3,"value",5);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) {
      pfStack_578 = (fdb_kvs_handle *)0x1129a8;
      compact_upto_post_snapshot_test();
      goto LAB_001129a8;
    }
    pfStack_578 = (fdb_kvs_handle *)0x112760;
    fdb_commit(pfStack_558,'\x01');
    uVar8 = (int)pcVar6 + 1;
    pcVar6 = (char *)(ulong)uVar8;
  } while (uVar8 != 10);
  pfStack_578 = (fdb_kvs_handle *)0x112776;
  pfVar13 = pfStack_560;
  fVar1 = fdb_get_kvs_info(pfStack_560,&fStack_530);
  uVar8 = (uint)pfVar13;
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcVar16 = (char *)&fStack_530.last_seqnum;
    if (fStack_530.last_seqnum != 10) {
      pfStack_578 = (fdb_kvs_handle *)0x112791;
      compact_upto_post_snapshot_test();
    }
    pfStack_578 = (fdb_kvs_handle *)0x1127a5;
    pfVar13 = pfStack_560;
    fVar1 = fdb_snapshot_open(pfStack_560,&pfStack_568,5);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129bc;
    pfStack_578 = (fdb_kvs_handle *)0x1127bc;
    pfVar13 = pfStack_568;
    fVar1 = fdb_get_kvs_info(pfStack_568,&fStack_530);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c1;
    if (fStack_530.last_seqnum != 5) {
      pfStack_578 = (fdb_kvs_handle *)0x1127d4;
      compact_upto_post_snapshot_test();
    }
    pfStack_578 = (fdb_kvs_handle *)0x1127e8;
    pfVar11 = pfStack_558;
    fVar1 = fdb_get_all_snap_markers(pfStack_558,&pfStack_540,&uStack_538);
    uVar8 = (uint)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129c6;
    pfStack_578 = (fdb_kvs_handle *)0x112805;
    pfVar11 = pfStack_558;
    fVar1 = fdb_compact_upto(pfStack_558,(char *)0x0,pfStack_540[5].marker);
    uVar8 = (uint)pfVar11;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129cb;
    pfStack_578 = (fdb_kvs_handle *)0x11281c;
    fVar1 = fdb_free_snap_markers(pfStack_540,uStack_538);
    uVar8 = (uint)pfStack_540;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d0;
    pfStack_578 = (fdb_kvs_handle *)0x112833;
    pfVar13 = pfStack_560;
    fVar1 = fdb_get_kvs_info(pfStack_560,&fStack_530);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129d5;
    if (fStack_530.last_seqnum != 10) {
      pfStack_578 = (fdb_kvs_handle *)0x11284b;
      compact_upto_post_snapshot_test();
    }
    pfStack_578 = (fdb_kvs_handle *)0x11285a;
    pfVar13 = pfStack_568;
    fVar1 = fdb_get_kvs_info(pfStack_568,&fStack_530);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129da;
    if (fStack_530.last_seqnum != 5) {
      pfStack_578 = (fdb_kvs_handle *)0x112872;
      compact_upto_post_snapshot_test();
    }
    pfStack_578 = (fdb_kvs_handle *)0x112892;
    pfVar13 = pfStack_568;
    fVar1 = fdb_iterator_init(pfStack_568,&pfStack_548,(void *)0x0,0,(void *)0x0,0,0);
    uVar8 = (uint)pfVar13;
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129df;
    pcVar6 = (char *)0x5;
    doc = &pfStack_550;
    info = &fStack_530;
    do {
      pfStack_578 = (fdb_kvs_handle *)0x1128b6;
      pfVar12 = pfStack_548;
      fVar1 = fdb_iterator_get(pfStack_548,doc);
      uVar8 = (uint)pfVar12;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129a8;
      pfStack_578 = (fdb_kvs_handle *)0x1128c8;
      fdb_doc_free(pfStack_550);
      pfStack_550 = (fdb_doc *)0x0;
      pfStack_578 = (fdb_kvs_handle *)0x1128de;
      pfVar13 = pfStack_560;
      fVar1 = fdb_get_kvs_info(pfStack_560,info);
      uVar8 = (uint)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129ad;
      if (fStack_530.last_seqnum != 10) {
        pfStack_578 = (fdb_kvs_handle *)0x112926;
        compact_upto_post_snapshot_test();
      }
      pfStack_578 = (fdb_kvs_handle *)0x1128fb;
      pfVar13 = pfStack_568;
      fVar1 = fdb_get_kvs_info(pfStack_568,info);
      uVar8 = (uint)pfVar13;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001129b2;
      if (fStack_530.last_seqnum != 5) {
        pfStack_578 = (fdb_kvs_handle *)0x112930;
        compact_upto_post_snapshot_test();
      }
      pfStack_578 = (fdb_kvs_handle *)0x112915;
      pfVar12 = pfStack_548;
      fVar1 = fdb_iterator_next(pfStack_548);
      uVar8 = (uint)pfVar12;
      uVar9 = (int)pcVar6 - 1;
      pcVar6 = (char *)(ulong)uVar9;
    } while (fVar1 != FDB_RESULT_ITERATOR_FAIL);
    if (uVar9 == 0) {
      pfStack_578 = (fdb_kvs_handle *)0x112944;
      fdb_iterator_close(pfStack_548);
      pfStack_578 = (fdb_kvs_handle *)0x11294e;
      fdb_kvs_close(pfStack_568);
      pfStack_578 = (fdb_kvs_handle *)0x112958;
      fdb_close(pfStack_558);
      pfStack_578 = (fdb_kvs_handle *)0x11295d;
      fdb_shutdown();
      pfStack_578 = (fdb_kvs_handle *)0x112962;
      memleak_end();
      pcVar16 = "%s PASSED\n";
      if (compact_upto_post_snapshot_test()::__test_pass != '\0') {
        pcVar16 = "%s FAILED\n";
      }
      pfStack_578 = (fdb_kvs_handle *)0x112993;
      fprintf(_stderr,pcVar16,"compact upto post snapshot test");
      return;
    }
  }
  else {
LAB_001129b7:
    pfStack_578 = (fdb_kvs_handle *)0x1129bc;
    compact_upto_post_snapshot_test();
LAB_001129bc:
    pfStack_578 = (fdb_kvs_handle *)0x1129c1;
    compact_upto_post_snapshot_test();
LAB_001129c1:
    pfStack_578 = (fdb_kvs_handle *)0x1129c6;
    compact_upto_post_snapshot_test();
LAB_001129c6:
    pfStack_578 = (fdb_kvs_handle *)0x1129cb;
    compact_upto_post_snapshot_test();
LAB_001129cb:
    pfStack_578 = (fdb_kvs_handle *)0x1129d0;
    compact_upto_post_snapshot_test();
LAB_001129d0:
    pfStack_578 = (fdb_kvs_handle *)0x1129d5;
    compact_upto_post_snapshot_test();
LAB_001129d5:
    pfStack_578 = (fdb_kvs_handle *)0x1129da;
    compact_upto_post_snapshot_test();
LAB_001129da:
    pfStack_578 = (fdb_kvs_handle *)0x1129df;
    compact_upto_post_snapshot_test();
LAB_001129df:
    pfStack_578 = (fdb_kvs_handle *)0x1129e4;
    compact_upto_post_snapshot_test();
  }
  pfStack_578 = (fdb_kvs_handle *)compact_upto_overwrite_test;
  compact_upto_post_snapshot_test();
  pfStack_598 = pfVar5;
  doc_00 = (fdb_kvs_handle *)0x0;
  pfStackY_960 = (fdb_kvs_handle *)0x112a10;
  uStack_93c = uVar8;
  pfStack_5a0 = (fdb_seqnum_t *)pcVar16;
  pfStack_590 = unaff_R13;
  ppfStack_588 = doc;
  pfStack_580 = info;
  pfStack_578 = (fdb_kvs_handle *)pcVar6;
  gettimeofday(&tStack_7d8,(__timezone_ptr_t)0x0);
  builtin_strncpy(acStack_8d8,"rm -rf  compact_test* > errorlog.txt",0x25);
  pfStackY_960 = (fdb_kvs_handle *)0x112a40;
  system(acStack_8d8);
  pfStackY_960 = (fdb_kvs_handle *)0x112a45;
  memleak_start();
  pfStackY_960 = (fdb_kvs_handle *)0x112a4f;
  pcVar16 = (char *)malloc(0x20);
  pfVar13 = (fdb_kvs_handle *)(auStack_7c8 + 0x130);
  pfStackY_960 = (fdb_kvs_handle *)0x112a62;
  fdb_get_default_config();
  uStack_678 = 0x201;
  uStack_680 = 1;
  uStack_658 = 1;
  sStack_690 = 0;
  plStack_5e0 = (list *)0x0;
  pfStackY_960 = (fdb_kvs_handle *)0x112a85;
  fdb_get_default_kvs_config();
  pfStackY_960 = (fdb_kvs_handle *)0x112a99;
  fVar1 = fdb_open(&pfStack_930,"./compact_test",(fdb_config *)pfVar13);
  if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_001130a7:
    pfStackY_960 = (fdb_kvs_handle *)0x1130ac;
    compact_upto_overwrite_test();
LAB_001130ac:
    pfStackY_960 = (fdb_kvs_handle *)0x1130b1;
    compact_upto_overwrite_test();
LAB_001130b1:
    pfStackY_960 = (fdb_kvs_handle *)0x1130b6;
    compact_upto_overwrite_test();
LAB_001130b6:
    pfStackY_960 = (fdb_kvs_handle *)0x1130bb;
    compact_upto_overwrite_test();
LAB_001130bb:
    pfStackY_960 = (fdb_kvs_handle *)0x1130c0;
    compact_upto_overwrite_test();
LAB_001130c0:
    pfStackY_960 = (fdb_kvs_handle *)0x1130c5;
    compact_upto_overwrite_test();
LAB_001130c5:
    pfStackY_960 = (fdb_kvs_handle *)0x1130ca;
    compact_upto_overwrite_test();
LAB_001130ca:
    pfStackY_960 = (fdb_kvs_handle *)0x1130cf;
    compact_upto_overwrite_test();
LAB_001130cf:
    pfStackY_960 = (fdb_kvs_handle *)0x1130d4;
    compact_upto_overwrite_test();
LAB_001130d4:
    pfStackY_960 = (fdb_kvs_handle *)compact_with_snapshot_open_test;
    compact_upto_overwrite_test();
    pcStackY_cf8 = (code *)0x1130f6;
    pfStackY_988 = pfVar13;
    pfStackY_980 = pfVar5;
    pfStackY_978 = unaff_R13;
    pcStackY_970 = pcVar16;
    pfStackY_968 = doc_00;
    pfStackY_960 = (fdb_kvs_handle *)pcVar6;
    gettimeofday(&tStackY_cb0,(__timezone_ptr_t)0x0);
    pcStackY_cf8 = (code *)0x1130fb;
    memleak_start();
    pcStackY_cf8 = (code *)0x113108;
    fdb_get_default_config();
    pcStackY_cf8 = (code *)0x113115;
    fdb_get_default_kvs_config();
    fStackY_c88.compaction_cb_ctx = &uStackY_cd0;
    uStackY_cd0 = 0;
    uStackY_cc8 = 0;
    pfStackY_cc0 = (fdb_kvs_handle *)0x0;
    fStackY_c88.wal_threshold = 0x400;
    fStackY_c88.flags = 1;
    fStackY_c88.compaction_cb = compaction_cb_get;
    fStackY_c88.compaction_cb_mask = 0x1b;
    pcStackY_cf8 = (code *)0x11315b;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_cf8 = (code *)0x113170;
    fdb_open((fdb_file_handle **)&pfStackY_cf0,"./compact_test1",&fStackY_c88);
    pcStackY_cf8 = (code *)0x11318a;
    fdb_kvs_open((fdb_file_handle *)pfStackY_cf0,&pfStackY_cd8,"db",&fStackY_ca0);
    pcStackY_cf8 = (code *)0x11319d;
    fdb_kvs_open((fdb_file_handle *)pfStackY_cf0,&pfStackY_ce8,"db",&fStackY_ca0);
    uVar10 = 0;
    do {
      pcStackY_cf8 = (code *)0x1131c9;
      sprintf((char *)apfStackY_a90,"key%04d",uVar10);
      pcStackY_cf8 = (code *)0x1131d8;
      sprintf(acStackY_b90,"body%04d",uVar10);
      pfVar5 = pfStackY_cd8;
      pcStackY_cf8 = (code *)0x1131e5;
      sVar3 = strlen((char *)apfStackY_a90);
      pcStackY_cf8 = (code *)0x1131f0;
      sVar4 = strlen(acStackY_b90);
      pcStackY_cf8 = (code *)0x113204;
      ptr_handle = apfStackY_a90;
      pfVar13 = pfVar5;
      fVar1 = fdb_set_kv(pfVar5,apfStackY_a90,sVar3,acStackY_b90,sVar4);
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_cf8 = (code *)0x1132c9;
        compact_with_snapshot_open_test();
        goto LAB_001132c9;
      }
      uVar8 = (int)uVar10 + 1;
      uVar10 = (ulong)uVar8;
    } while (uVar8 != 100000);
    ptr_handle = (fdb_kvs_handle **)0x1;
    pcStackY_cf8 = (code *)0x113224;
    pfVar13 = pfStackY_cf0;
    fVar1 = fdb_commit((fdb_file_handle *)pfStackY_cf0,'\x01');
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pfStackY_cc0 = pfStackY_ce8;
      ptr_handle = (fdb_kvs_handle **)0x0;
      pcStackY_cf8 = (code *)0x113241;
      pfVar13 = pfStackY_cf0;
      fVar1 = fdb_compact((fdb_file_handle *)pfStackY_cf0,(char *)0x0);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132ce;
      ptr_handle = &pfStackY_ce0;
      pcStackY_cf8 = (code *)0x11325d;
      pfVar13 = pfStackY_ce8;
      fVar1 = fdb_snapshot_open(pfStackY_ce8,ptr_handle,100000);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d3;
      pcStackY_cf8 = (code *)0x11326b;
      fdb_kvs_close(pfStackY_ce0);
      pcStackY_cf8 = (code *)0x113274;
      fVar1 = fdb_close((fdb_file_handle *)pfStackY_cf0);
      pfVar13 = pfStackY_cf0;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001132d8;
      pcStackY_cf8 = (code *)0x11327d;
      fVar1 = fdb_shutdown();
      pfVar13 = pfStackY_cf0;
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar16 = "%s PASSED\n";
        if (compact_with_snapshot_open_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        pcStackY_cf8 = (code *)0x1132b2;
        fprintf(_stderr,pcVar16,"compact with snapshot_open test");
        return;
      }
    }
    else {
LAB_001132c9:
      pcStackY_cf8 = (code *)0x1132ce;
      compact_with_snapshot_open_test();
LAB_001132ce:
      pcStackY_cf8 = (code *)0x1132d3;
      compact_with_snapshot_open_test();
LAB_001132d3:
      pcStackY_cf8 = (code *)0x1132d8;
      compact_with_snapshot_open_test();
LAB_001132d8:
      pcStackY_cf8 = (code *)0x1132dd;
      compact_with_snapshot_open_test();
    }
    pcStackY_cf8 = compaction_cb_get;
    compact_with_snapshot_open_test();
    pcStackY_d40 = (code *)0x1132fe;
    sStackY_d08 = sVar3;
    ppfStackY_d00 = apfStackY_a90;
    pcStackY_cf8 = (code *)uVar10;
    gettimeofday(&tStackY_d18,(__timezone_ptr_t)0x0);
    if ((int)ptr_handle == 2) {
      if (extraout_RDX == 0) {
        pcStackY_d40 = (code *)0x11330d;
        compaction_cb_get();
        goto LAB_0011330d;
      }
    }
    else {
LAB_0011330d:
      if (extraout_RDX != 0) goto LAB_00113374;
    }
    pcStackY_d40 = (code *)0x113324;
    fVar1 = fdb_get_all_snap_markers((fdb_file_handle *)pfVar13,&pfStackY_d30,&uStackY_d20);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_d40 = (code *)0x113348;
      fVar1 = fdb_snapshot_open((fdb_kvs_handle *)(pfStackY_ce8->kvs_config).custom_cmp_param,
                                &pfStackY_d28,pfStackY_d30->kvs_markers->seqnum);
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011336a;
      pcStackY_d40 = (code *)0x113356;
      fVar1 = fdb_kvs_close(pfStackY_d28);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        return;
      }
    }
    else {
      pcStackY_d40 = (code *)0x11336a;
      compaction_cb_get();
LAB_0011336a:
      pcStackY_d40 = (code *)0x11336f;
      compaction_cb_get();
    }
    pcStackY_d40 = (code *)0x113374;
    compaction_cb_get();
LAB_00113374:
    pcStackY_d40 = compact_with_snapshot_open_multi_kvs_test;
    compaction_cb_get();
    pcStackY_d48 = "body%04d";
    pfStackY_d58 = pfVar5;
    pcStackY_10f8 = (code *)0x113396;
    pcStackY_d60 = acStackY_b90;
    pcStackY_d40 = (code *)((ulong)ptr_handle & 0xffffffff);
    gettimeofday(&tStackY_1090,(__timezone_ptr_t)0x0);
    pcStackY_10f8 = (code *)0x11339b;
    memleak_start();
    pcStackY_10f8 = (code *)0x1133ab;
    fdb_get_default_config();
    pcStackY_10f8 = (code *)0x1133b8;
    fdb_get_default_kvs_config();
    fStackY_1068.compaction_cb_ctx = &uStackY_10b0;
    uStackY_10b0 = 0;
    uStackY_10a8 = 0;
    uStackY_10a0 = 0;
    fStackY_1068.wal_threshold = 0x400;
    fStackY_1068.flags = 1;
    fStackY_1068.compaction_cb = compaction_cb_markers;
    fStackY_1068.compaction_cb_mask = 0x1b;
    pcStackY_10f8 = (code *)0x1133fe;
    system("rm -rf  compact_test* > errorlog.txt");
    pcStackY_10f8 = (code *)0x113415;
    fdb_open(&pfStackY_10e8,"./compact_test1",&fStackY_1068);
    pcStackY_10f8 = (code *)0x11342c;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10b8,"db1",&fStackY_1080);
    pcStackY_10f8 = (code *)0x113443;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10c0,"db2",&fStackY_1080);
    pcStackY_10f8 = (code *)0x11345a;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10c8,"db3",&fStackY_1080);
    pcStackY_10f8 = (code *)0x113471;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10d0,"db4",&fStackY_1080);
    pcStackY_10f8 = (code *)0x113488;
    fdb_kvs_open(pfStackY_10e8,&pfStackY_10d8,"db5",&fStackY_1080);
    uVar10 = 0;
    do {
      iVar2 = (int)uVar10;
      if (iVar2 == 5) goto LAB_0011360c;
      uVar10 = 0;
      iStackY_10dc = iVar2;
      do {
        pcStackY_10f8 = (code *)0x1134c6;
        sprintf(acStackY_e70,"key%04d",uVar10);
        pcStackY_10f8 = (code *)0x1134d5;
        sprintf(acStackY_f70,"body%04d",uVar10);
        pfVar5 = pfStackY_10b8;
        pcStackY_10f8 = (code *)0x1134e2;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x1134f0;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113504;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10c0;
        pcStackY_10f8 = (code *)0x113511;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x11351c;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113530;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10c8;
        pcStackY_10f8 = (code *)0x11353d;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x113548;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x11355c;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar5 = pfStackY_10d0;
        pcStackY_10f8 = (code *)0x113569;
        sVar3 = strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x113574;
        sVar4 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x113588;
        fdb_set_kv(pfVar5,acStackY_e70,sVar3,acStackY_f70,sVar4);
        pfVar13 = pfStackY_10d8;
        pcStackY_10f8 = (code *)0x113595;
        pfVar5 = (fdb_kvs_handle *)strlen(acStackY_e70);
        pcStackY_10f8 = (code *)0x1135a0;
        sVar3 = strlen(acStackY_f70);
        pcStackY_10f8 = (code *)0x1135be;
        fdb_set_kv(pfVar13,acStackY_e70,(size_t)pfVar5,acStackY_f70,sVar3);
        uVar8 = (int)uVar10 + 1;
        uVar10 = (ulong)uVar8;
      } while (uVar8 != 1000);
      pcStackY_10f8 = (code *)0x1135db;
      pfVar11 = pfStackY_10e8;
      fVar1 = fdb_commit(pfStackY_10e8,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
        pcStackY_10f8 = (code *)0x11366b;
        compact_with_snapshot_open_multi_kvs_test();
        goto LAB_0011366b;
      }
      uVar10 = (ulong)(iStackY_10dc + 1U);
      uStackY_10b0 = CONCAT44(uStackY_10b0._4_4_,(iStackY_10dc + 1U) * 1000);
      pcStackY_10f8 = (code *)0x1135ff;
      fVar1 = fdb_compact(pfStackY_10e8,(char *)0x0);
    } while (fVar1 == FDB_RESULT_SUCCESS);
    pcStackY_10f8 = (code *)0x11360c;
    compact_with_snapshot_open_multi_kvs_test();
LAB_0011360c:
    pcStackY_10f8 = (code *)0x113616;
    pfVar11 = pfStackY_10e8;
    fVar1 = fdb_close(pfStackY_10e8);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      pcStackY_10f8 = (code *)0x11361f;
      fVar1 = fdb_shutdown();
      if (fVar1 == FDB_RESULT_SUCCESS) {
        pcVar16 = "%s PASSED\n";
        if (compact_with_snapshot_open_multi_kvs_test()::__test_pass != '\0') {
          pcVar16 = "%s FAILED\n";
        }
        pcStackY_10f8 = (code *)0x113654;
        fprintf(_stderr,pcVar16,"compact with snapshot_open multi kvs test");
        return;
      }
    }
    else {
LAB_0011366b:
      pcStackY_10f8 = (code *)0x113670;
      compact_with_snapshot_open_multi_kvs_test();
    }
    pcStackY_10f8 = compaction_cb_markers;
    compact_with_snapshot_open_multi_kvs_test();
    pcStackY_1100 = "body%04d";
    pcStackY_1120 = "key%04d";
    pcStackY_1170 = (code *)0x11369a;
    pcStackY_1118 = acStackY_f70;
    pfStackY_1110 = pfVar5;
    pcStackY_1108 = acStackY_e70;
    pcStackY_10f8 = (code *)uVar10;
    gettimeofday(&tStackY_1130,(__timezone_ptr_t)0x0);
    pcStackY_1170 = (code *)0x1136a4;
    fdb_get_default_kvs_config();
    iVar2 = *(int *)&pfStackY_10e8->root;
    pcStackY_1170 = (code *)0x1136b7;
    fVar1 = fdb_get_all_snap_markers(pfVar11,&pfStackY_1168,&uStackY_1160);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      if (pfStackY_1168->num_kvs_markers != 6) {
        pcStackY_1170 = (code *)0x113799;
        compaction_cb_markers();
      }
      seqnum = pfStackY_1168->kvs_markers->seqnum;
      if (seqnum == (long)iVar2) {
        if (uStackY_1160 != 0) {
          uVar10 = 0;
          do {
            if (pfStackY_1168[uVar10].num_kvs_markers != 0) {
              lVar14 = 0;
              uVar15 = 0;
              do {
                pcVar16 = *(char **)((long)&(pfStackY_1168[uVar10].kvs_markers)->kv_store_name +
                                    lVar14);
                if (pcVar16 != (char *)0x0) {
                  pcStackY_1170 = (code *)0x11372e;
                  fdb_kvs_open(pfVar11,&pfStackY_1158,pcVar16,&fStackY_1148);
                  pcStackY_1170 = (code *)0x113740;
                  fVar1 = fdb_snapshot_open(pfStackY_1158,&pfStackY_1150,seqnum);
                  if (fVar1 == FDB_RESULT_SUCCESS) {
                    pcStackY_1170 = (code *)0x11374e;
                    fVar1 = fdb_kvs_close(pfStackY_1150);
                    if (fVar1 != FDB_RESULT_SUCCESS) {
                      pcStackY_1170 = (code *)0x1137a3;
                      compaction_cb_markers();
                      goto LAB_001137a3;
                    }
                    pcStackY_1170 = (code *)0x11375c;
                    fVar1 = fdb_kvs_close(pfStackY_1158);
                    if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113760;
                  }
                  else {
LAB_001137a3:
                    pcStackY_1170 = (code *)0x1137a8;
                    compaction_cb_markers();
                  }
                  pcStackY_1170 = (code *)0x1137ad;
                  compaction_cb_markers();
                  goto LAB_001137ad;
                }
LAB_00113760:
                uVar15 = uVar15 + 1;
                lVar14 = lVar14 + 0x10;
              } while (uVar15 < (ulong)pfStackY_1168[uVar10].num_kvs_markers);
            }
            uVar10 = uVar10 + 1;
          } while (uVar10 < uStackY_1160);
        }
        return;
      }
    }
    else {
LAB_001137ad:
      pcStackY_1170 = (code *)0x1137b2;
      compaction_cb_markers();
    }
    pcStackY_1170 = db_compact_during_compaction_cancellation;
    compaction_cb_markers();
    gettimeofday(&tStackY_1278,(__timezone_ptr_t)0x0);
    fdb_get_default_config();
    fStackY_1268.compaction_cb = cb_cancel_test;
    fStackY_1268.compaction_cb_ctx = (void *)0x0;
    fStackY_1268.compaction_cb_mask = 0x11;
    fVar1 = fdb_open(&pfStackY_1280,"compact_test",&fStackY_1268);
    if (fVar1 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
              ,0xcac);
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                    ,0xcac,"void *db_compact_during_compaction_cancellation(void *)");
    }
    fVar1 = fdb_compact(pfStackY_1280,(char *)0x0);
    if (((uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) < 0x2e) &&
       ((0x200004000001U >> ((ulong)(uint)(fVar1 + ~FDB_RESULT_SB_INIT_FAIL) & 0x3f) & 1) != 0)) {
      fdb_close(pfStackY_1280);
      pthread_exit((void *)0x0);
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
            ,0xcb1);
    __assert_fail("status == FDB_RESULT_SUCCESS || status == FDB_RESULT_COMPACTION_CANCELLATION || status == FDB_RESULT_FAIL_BY_ROLLBACK"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/compact_functional_test.cc"
                  ,0xcb1,"void *db_compact_during_compaction_cancellation(void *)");
  }
  pfStackY_960 = (fdb_kvs_handle *)0x112abc;
  fVar1 = fdb_kvs_open(pfStack_930,&pfStack_928,"db",&fStack_8f0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ac;
  pcVar6 = (char *)CONCAT71((int7)((ulong)pcVar6 >> 8),uStack_93c == 0);
  pcStack_920 = pcVar16 + 0x1a;
  pfVar5 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  unaff_R13 = (fdb_kvs_handle *)auStack_7c8;
  doc_00 = (fdb_kvs_handle *)0x0;
  do {
    uVar9 = (uint)doc_00;
    uVar8 = uVar9 + (int)((ulong)doc_00 / 5) * -5;
    pfStackY_960 = (fdb_kvs_handle *)0x112b17;
    sprintf((char *)pfVar5,"key%06d",(ulong)uVar8);
    builtin_strncpy(pcVar16,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_920,"<end>",6);
    pcVar17 = "updated_value%08d";
    if (uVar9 < 5) {
      pcVar17 = "value%08d";
    }
    pfStackY_960 = (fdb_kvs_handle *)0x112b5a;
    sprintf(pcVar16,pcVar17,(ulong)uVar8);
    pfVar13 = pfStack_928;
    pfStackY_960 = (fdb_kvs_handle *)0x112b67;
    sVar3 = strlen((char *)pfVar5);
    pfStackY_960 = (fdb_kvs_handle *)0x112b7f;
    fVar1 = fdb_set_kv(pfVar13,pfVar5,sVar3 + 1,pcVar16,0x20);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011305f;
    pfVar7 = doc_00;
    if (uStack_93c == 3) {
LAB_00112ba0:
      pcVar6 = (char *)((ulong)pfVar7 & 0xffffffffffffff01);
    }
    else if (uStack_93c == 2) {
      pfVar7 = (fdb_kvs_handle *)CONCAT71((int7)((ulong)doc_00 >> 8),~(byte)doc_00);
      goto LAB_00112ba0;
    }
    pfStackY_960 = (fdb_kvs_handle *)0x112bb2;
    fVar1 = fdb_commit(pfStack_930,(fdb_commit_opt_t)pcVar6);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113064;
    pfStackY_960 = (fdb_kvs_handle *)0x112bc7;
    fVar1 = fdb_get_kvs_info(pfStack_928,(fdb_kvs_info *)unaff_R13);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113069;
    doc_00 = (fdb_kvs_handle *)(ulong)(uVar9 + 1);
  } while (uVar9 + 1 != 10);
  pfStackY_960 = (fdb_kvs_handle *)0x112bf0;
  fVar1 = fdb_get_all_snap_markers(pfStack_930,&pfStack_910,(uint64_t *)&iStack_918);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b1;
  pfVar13 = (fdb_kvs_handle *)(CONCAT44(uStack_914,iStack_918) >> 1);
  iVar2 = (int)pfVar13;
  pfStackY_960 = (fdb_kvs_handle *)0x112c21;
  fVar1 = fdb_compact_upto(pfStack_930,"./compact_test2",pfStack_910[iVar2].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130b6;
  if (-1 < (int)(iStack_918 - 1U)) {
    pfVar13 = (fdb_kvs_handle *)(ulong)(iStack_918 - 1U);
    lStack_8f8 = (long)iVar2;
    pfVar5 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
    do {
      doc_00 = (fdb_kvs_handle *)(pfStack_910[(long)pfVar13].kvs_markers)->seqnum;
      pfStackY_960 = (fdb_kvs_handle *)0x112c6e;
      fVar1 = fdb_snapshot_open(pfStack_928,&pfStack_908,(fdb_seqnum_t)doc_00);
      if (lStack_8f8 < (long)pfVar13) {
        pfVar7 = pfVar13;
        if (fVar1 == FDB_RESULT_SUCCESS) goto LAB_00113089;
      }
      else {
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011308e;
        pfStackY_960 = (fdb_kvs_handle *)0x112caf;
        pfStack_900 = pfVar13;
        fVar1 = fdb_iterator_init(pfStack_908,&pfStack_948,(void *)0x0,0,(void *)0x0,0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113093;
        doc_00 = (fdb_kvs_handle *)((long)&doc_00[-1].bub_ctx.handle + 3);
        pfVar13 = (fdb_kvs_handle *)0x0;
        do {
          pfStack_938 = (fdb_kvs_handle *)0x0;
          pfStackY_960 = (fdb_kvs_handle *)0x112cd5;
          fVar1 = fdb_iterator_get(pfStack_948,(fdb_doc **)&pfStack_938);
          if (fVar1 != FDB_RESULT_SUCCESS) break;
          pfStackY_960 = (fdb_kvs_handle *)0x112cf0;
          sprintf((char *)pfVar5,"key%06d",(ulong)pfVar13 & 0xffffffff);
          builtin_strncpy(pcVar16,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
          builtin_strncpy(pcStack_920,"<end>",6);
          pcVar6 = "value%08d";
          if (pfVar13 < doc_00) {
            pcVar6 = "updated_value%08d";
          }
          pfStackY_960 = (fdb_kvs_handle *)0x112d32;
          sprintf(pcVar16,pcVar6,(ulong)pfVar13 & 0xffffffff);
          pcVar6 = (char *)pfStack_938;
          unaff_R13 = (fdb_kvs_handle *)pfStack_938->op_stats;
          pfStackY_960 = (fdb_kvs_handle *)0x112d4a;
          iVar2 = bcmp(unaff_R13,pfVar5,*(size_t *)&pfStack_938->kvs_config);
          if (iVar2 != 0) {
            pfStackY_960 = (fdb_kvs_handle *)0x113054;
            compact_upto_overwrite_test();
LAB_00113054:
            pfStackY_960 = (fdb_kvs_handle *)0x11305f;
            compact_upto_overwrite_test();
            goto LAB_0011305f;
          }
          unaff_R13 = (fdb_kvs_handle *)(((fdb_kvs_handle *)pcVar6)->field_6).seqtree;
          pfStackY_960 = (fdb_kvs_handle *)0x112d65;
          iVar2 = bcmp(unaff_R13,pcVar16,
                       (size_t)(((fdb_kvs_handle *)pcVar6)->kvs_config).custom_cmp_param);
          if (iVar2 != 0) goto LAB_00113054;
          pfVar13 = (fdb_kvs_handle *)&(pfVar13->kvs_config).field_0x1;
          pfStackY_960 = (fdb_kvs_handle *)0x112d78;
          fdb_doc_free((fdb_doc *)pcVar6);
          pfStackY_960 = (fdb_kvs_handle *)0x112d82;
          fVar1 = fdb_iterator_next(pfStack_948);
        } while (fVar1 == FDB_RESULT_SUCCESS);
        pfStackY_960 = (fdb_kvs_handle *)0x112d94;
        fVar1 = fdb_iterator_close(pfStack_948);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00113098;
        if ((int)pfVar13 != 5) goto LAB_001130a2;
        pfStackY_960 = (fdb_kvs_handle *)0x112daf;
        fVar1 = fdb_kvs_close(pfStack_908);
        pfVar13 = pfStack_900;
        pfVar7 = pfStack_900;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011309d;
      }
      pfVar13 = (fdb_kvs_handle *)((long)&pfVar7[-1].bub_ctx.handle + 7);
    } while (0 < (long)pfVar7);
  }
  pfVar5 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  pfStackY_960 = (fdb_kvs_handle *)0x112dec;
  fVar1 = fdb_iterator_init(pfStack_928,&pfStack_948,(void *)0x0,0,(void *)0x0,0,0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130bb;
  unaff_R13 = (fdb_kvs_handle *)(auStack_7c8 + 0x30);
  pcVar6 = "updated_value%08d";
  pfVar13 = (fdb_kvs_handle *)0x0;
  do {
    pfStack_938 = (fdb_kvs_handle *)0x0;
    pfStackY_960 = (fdb_kvs_handle *)0x112e1d;
    fVar1 = fdb_iterator_get(pfStack_948,(fdb_doc **)&pfStack_938);
    if (fVar1 != FDB_RESULT_SUCCESS) break;
    pfStackY_960 = (fdb_kvs_handle *)0x112e38;
    sprintf((char *)unaff_R13,"key%06d",pfVar13);
    builtin_strncpy(pcVar16,"xxxxxxxxxxxxxxxxxxxxxxxxxxxxxxxx",0x20);
    builtin_strncpy(pcStack_920,"<end>",6);
    pfStackY_960 = (fdb_kvs_handle *)0x112e68;
    sprintf(pcVar16,"updated_value%08d",pfVar13);
    doc_00 = pfStack_938;
    pfVar5 = (fdb_kvs_handle *)pfStack_938->op_stats;
    pfStackY_960 = (fdb_kvs_handle *)0x112e7f;
    iVar2 = bcmp(pfVar5,unaff_R13,*(size_t *)&pfStack_938->kvs_config);
    if (iVar2 != 0) goto LAB_0011306e;
    pfVar5 = (fdb_kvs_handle *)(doc_00->field_6).seqtree;
    pfStackY_960 = (fdb_kvs_handle *)0x112e9a;
    iVar2 = bcmp(pfVar5,pcVar16,(size_t)(doc_00->kvs_config).custom_cmp_param);
    if (iVar2 != 0) goto LAB_0011307e;
    pfVar13 = (fdb_kvs_handle *)(ulong)((int)pfVar13 + 1);
    pfStackY_960 = (fdb_kvs_handle *)0x112eac;
    fdb_doc_free((fdb_doc *)doc_00);
    pfStackY_960 = (fdb_kvs_handle *)0x112eb6;
    fVar1 = fdb_iterator_next(pfStack_948);
  } while (fVar1 == FDB_RESULT_SUCCESS);
  pfStackY_960 = (fdb_kvs_handle *)0x112ec8;
  fVar1 = fdb_iterator_close(pfStack_948);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130c0;
  if ((int)pfVar13 != 5) goto LAB_001130c5;
  pfStackY_960 = (fdb_kvs_handle *)0x112ee8;
  fVar1 = fdb_free_snap_markers(pfStack_910,CONCAT44(uStack_914,iStack_918));
  uVar8 = uStack_93c;
  pfVar13 = (fdb_kvs_handle *)(ulong)uStack_93c;
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130ca;
  pfStackY_960 = (fdb_kvs_handle *)0x112efc;
  free(pcVar16);
  pfStackY_960 = (fdb_kvs_handle *)0x112f06;
  fVar1 = fdb_close(pfStack_930);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130cf;
  pfStackY_960 = (fdb_kvs_handle *)0x112f13;
  fVar1 = fdb_shutdown();
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001130d4;
  pfStackY_960 = (fdb_kvs_handle *)0x112f20;
  memleak_end();
  builtin_strncpy(acStack_8d8 + 0x10,"rwrite test",0xc);
  builtin_strncpy(acStack_8d8,"compact upto ove",0x10);
  switch(uVar8) {
  case 0:
    pfStackY_960 = (fdb_kvs_handle *)0x112f66;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3," (HB+trie)",0xb);
    break;
  case 1:
    pfStackY_960 = (fdb_kvs_handle *)0x112fea;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3," (WAL)",7);
    break;
  case 2:
    pfStackY_960 = (fdb_kvs_handle *)0x112f92;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3 + 0xe,"ie/WAL)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'H';
    uVar18._2_1_ = 'B';
    uVar18._3_1_ = '+';
    uVar19._0_1_ = 't';
    uVar19._1_1_ = 'r';
    uVar19._2_1_ = 'i';
    uVar19._3_1_ = 'e';
    goto LAB_00112fd3;
  case 3:
    pfStackY_960 = (fdb_kvs_handle *)0x112fba;
    sVar3 = strlen(acStack_8d8);
    builtin_strncpy(acStack_8d8 + sVar3 + 0xe,"B+trie)",8);
    uVar18._0_1_ = ' ';
    uVar18._1_1_ = 'W';
    uVar18._2_1_ = 'A';
    uVar18._3_1_ = 'L';
    uVar19._0_1_ = '/';
    uVar19._1_1_ = 'H';
    uVar19._2_1_ = 'B';
    uVar19._3_1_ = '+';
LAB_00112fd3:
    pcVar16 = acStack_8d8 + sVar3;
    pcVar16[0] = ' ';
    pcVar16[1] = '(';
    pcVar16[2] = 'm';
    pcVar16[3] = 'i';
    pcVar16 = acStack_8d8 + sVar3 + 4;
    pcVar16[0] = 'x';
    pcVar16[1] = 'e';
    pcVar16[2] = 'd';
    pcVar16[3] = ',';
    *(undefined4 *)(acStack_8d8 + sVar3 + 8) = uVar18;
    *(undefined4 *)(acStack_8d8 + sVar3 + 0xc) = uVar19;
  }
  pcVar16 = "%s PASSED\n";
  if (compact_upto_overwrite_test(int)::__test_pass != '\0') {
    pcVar16 = "%s FAILED\n";
  }
  pfStackY_960 = (fdb_kvs_handle *)0x113032;
  fprintf(_stderr,pcVar16,acStack_8d8);
  return;
}

Assistant:

void wal_delete_compact_upto_test()
{
    TEST_INIT();
    memleak_start();
    int i, r;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db;
    fdb_snapshot_info_t *markers;
    fdb_status status;
    uint64_t num_markers;
    fdb_kvs_info kvs_info;
    char keybuf[256];
    void *value;
    size_t valuelen;

    // remove previous compact_test files
    r = system(SHELL_DEL " compact_test* > errorlog.txt");
    (void)r;

    fdb_config fconfig = fdb_get_default_config();
    fdb_kvs_config kvs_config = fdb_get_default_kvs_config();
    fconfig.wal_threshold = 19;
    fconfig.flags = FDB_OPEN_FLAG_CREATE;

    // open db
    fdb_open(&dbfile, "./compact_test5", &fconfig);
    fdb_kvs_open_default(dbfile, &db, &kvs_config);

    // insert a few keys...
    for (i=0;i<10;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }

    status = fdb_commit(dbfile, FDB_COMMIT_MANUAL_WAL_FLUSH);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // insert keys such that last insert causes wal flush...
    for (; i<20;++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_set_kv(db, keybuf, strlen(keybuf),
                            (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now delete half of the newly inserted keys
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_del_kv(db, keybuf, strlen(keybuf));
        TEST_CHK(status == FDB_RESULT_SUCCESS);
    }
    // Now deleted items are in the unflushed wal..
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Create another header for compact_upto()
    sprintf(keybuf, "key%d", i);
    status = fdb_set_kv(db, keybuf, strlen(keybuf),
            (void*)"value", 5);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Get all snap markers..
    status = fdb_get_all_snap_markers(dbfile, &markers,
                                      &num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // compact upto the delete wal's marker...
    status = fdb_compact_upto(dbfile, NULL, markers[1].marker);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    status = fdb_free_snap_markers(markers, num_markers);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    status = fdb_get_kvs_info(db, &kvs_info);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // Deleted items should not be found..
    for (i = 15; i < 20; ++i){
        sprintf(keybuf, "key%d", i);
        status = fdb_get_kv(db, keybuf, strlen(keybuf), &value, &valuelen);
        TEST_CHK(status == FDB_RESULT_KEY_NOT_FOUND);
    }

    fdb_kvs_close(db);
    fdb_close(dbfile);
    fdb_shutdown();
    memleak_end();
    TEST_RESULT("compact upto with wal deletes test");
}